

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void __thiscall
QApplicationPrivate::activateImplicitTouchGrab
          (QApplicationPrivate *this,QWidget *widget,QTouchEvent *touchEvent,
          ImplicitTouchGrabMode grabMode)

{
  byte bVar1;
  QEventPoint *p;
  QObject *pQVar2;
  int i;
  ulong uVar3;
  
  if (*(short *)(touchEvent + 8) == 0xc2) {
    for (uVar3 = 0; uVar3 < *(ulong *)(touchEvent + 0x38); uVar3 = uVar3 + 1) {
      p = (QEventPoint *)QPointerEvent::point((longlong)touchEvent);
      pQVar2 = QMutableEventPoint::target(p);
      if ((pQVar2 == (QObject *)0x0) &&
         (bVar1 = QEventPoint::isAccepted(), (grabMode != GrabAllPoints & (bVar1 ^ 1)) == 0)) {
        QMutableEventPoint::setTarget(p,&widget->super_QObject);
      }
    }
  }
  return;
}

Assistant:

void QApplicationPrivate::activateImplicitTouchGrab(QWidget *widget, QTouchEvent *touchEvent,
                                                    ImplicitTouchGrabMode grabMode)
{
    if (touchEvent->type() != QEvent::TouchBegin)
        return;

    // If the widget dispatched the event further (see QGraphicsProxyWidget), then
    // there might already be an implicit grabber. Don't override that. A widget that
    // has partially recognized a gesture needs to grab all points.
    for (int i = 0; i < touchEvent->pointCount(); ++i) {
        auto &ep = touchEvent->point(i);
        if (!QMutableEventPoint::target(ep) && (ep.isAccepted() || grabMode == GrabAllPoints))
            QMutableEventPoint::setTarget(ep, widget);
    }
    // TODO setExclusiveGrabber() to be consistent with Qt Quick?
}